

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdom.cpp
# Opt level: O1

QDomNode __thiscall QDomNode::appendChild(QDomNode *this,QDomNode *newChild)

{
  QDomNodePrivate *pQVar1;
  int iVar2;
  undefined4 extraout_var;
  undefined8 *in_RDX;
  
  pQVar1 = newChild->impl;
  if (pQVar1 == (QDomNodePrivate *)0x0) {
    appendChild(this);
  }
  else {
    iVar2 = (*pQVar1->_vptr_QDomNodePrivate[7])(pQVar1,*in_RDX);
    QDomNode(this,(QDomNodePrivate *)CONCAT44(extraout_var,iVar2));
  }
  return (QDomNode)(QDomNodePrivate *)this;
}

Assistant:

QDomNode QDomNode::appendChild(const QDomNode& newChild)
{
    if (!impl) {
        qWarning("Calling appendChild() on a null node does nothing.");
        return QDomNode();
    }
    return QDomNode(IMPL->appendChild(newChild.impl));
}